

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u32.cpp
# Opt level: O2

void T_UConverter_toUnicode_UTF32_BE_OFFSET_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  UConverter *pUVar2;
  byte *pbVar3;
  UChar *pUVar4;
  byte *pbVar5;
  int *piVar6;
  UChar *pUVar7;
  int iVar8;
  UChar UVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int *piVar13;
  
  pUVar2 = args->converter;
  pbVar5 = (byte *)args->source;
  pUVar7 = args->target;
  piVar6 = args->offsets;
  pbVar3 = (byte *)args->sourceLimit;
  pUVar4 = args->targetLimit;
  uVar11 = (ulong)pUVar2->toULength;
  if (pUVar4 <= pUVar7 || (long)uVar11 < 1) {
    iVar8 = 0;
    goto LAB_0031ce16;
  }
  pUVar2->toULength = '\0';
  uVar10 = pUVar2->toUnicodeStatus - 1;
  pUVar2->toUnicodeStatus = 0;
  iVar8 = 0;
  do {
    for (; uVar11 < 4; uVar11 = uVar11 + 1) {
      if (pbVar3 <= pbVar5) {
        pUVar2 = args->converter;
        pUVar2->toUnicodeStatus = uVar10 + 1;
        pUVar2->toULength = (int8_t)uVar11;
        goto LAB_0031cea3;
      }
      bVar1 = *pbVar5;
      uVar10 = uVar10 << 8 | (uint)bVar1;
      pbVar5 = pbVar5 + 1;
      pUVar2->toUBytes[uVar11] = bVar1;
    }
    if ((0x10ffff < uVar10) || ((uVar10 & 0x1ff800) == 0xd800)) {
      args->converter->toULength = (int8_t)uVar11;
      *err = U_ILLEGAL_CHAR_FOUND;
      break;
    }
    if (uVar10 < 0x10000) {
      *pUVar7 = (UChar)uVar10;
      pUVar7 = pUVar7 + 1;
      lVar12 = 4;
      piVar13 = piVar6;
    }
    else {
      *pUVar7 = (short)(uVar10 >> 10) + L'ퟀ';
      piVar13 = piVar6 + 1;
      *piVar6 = iVar8;
      UVar9 = (UChar)uVar10 & 0x3ffU | 0xdc00;
      if (pUVar4 <= pUVar7 + 1) {
        pUVar2 = args->converter;
        pUVar2->UCharErrorBuffer[0] = UVar9;
        pUVar2->UCharErrorBufferLength = '\x01';
        *err = U_BUFFER_OVERFLOW_ERROR;
        piVar6 = piVar13;
        pUVar7 = pUVar7 + 1;
        break;
      }
      pUVar7[1] = UVar9;
      pUVar7 = pUVar7 + 2;
      lVar12 = 8;
    }
    piVar6 = (int *)((long)piVar6 + lVar12);
    *piVar13 = iVar8;
    iVar8 = iVar8 + (int)uVar11;
LAB_0031ce16:
    if (pbVar3 <= pbVar5) break;
    uVar10 = 0;
    uVar11 = 0;
  } while (pUVar7 < pUVar4);
LAB_0031cea3:
  if (((pbVar5 < pbVar3) && (pUVar4 <= pUVar7)) && (*err < U_ILLEGAL_ARGUMENT_ERROR)) {
    *err = U_BUFFER_OVERFLOW_ERROR;
  }
  args->target = pUVar7;
  args->source = (char *)pbVar5;
  args->offsets = piVar6;
  return;
}

Assistant:

static void U_CALLCONV
T_UConverter_toUnicode_UTF32_BE_OFFSET_LOGIC(UConverterToUnicodeArgs * args,
                                             UErrorCode * err)
{
    const unsigned char *mySource = (unsigned char *) args->source;
    UChar *myTarget = args->target;
    int32_t *myOffsets = args->offsets;
    const unsigned char *sourceLimit = (unsigned char *) args->sourceLimit;
    const UChar *targetLimit = args->targetLimit;
    unsigned char *toUBytes = args->converter->toUBytes;
    uint32_t ch, i;
    int32_t offsetNum = 0;

    /* Restore state of current sequence */
    if (args->converter->toULength > 0 && myTarget < targetLimit) {
        i = args->converter->toULength;       /* restore # of bytes consumed */
        args->converter->toULength = 0;

        ch = args->converter->toUnicodeStatus - 1;/*Stores the previously calculated ch from a previous call*/
        args->converter->toUnicodeStatus = 0;
        goto morebytes;
    }

    while (mySource < sourceLimit && myTarget < targetLimit) {
        i = 0;
        ch = 0;
morebytes:
        while (i < sizeof(uint32_t)) {
            if (mySource < sourceLimit) {
                ch = (ch << 8) | (uint8_t)(*mySource);
                toUBytes[i++] = (char) *(mySource++);
            }
            else {
                /* stores a partially calculated target*/
                /* + 1 to make 0 a valid character */
                args->converter->toUnicodeStatus = ch + 1;
                args->converter->toULength = (int8_t) i;
                goto donefornow;
            }
        }

        if (ch <= MAXIMUM_UTF && !U_IS_SURROGATE(ch)) {
            /* Normal valid byte when the loop has not prematurely terminated (i < inBytes) */
            if (ch <= MAXIMUM_UCS2) {
                /* fits in 16 bits */
                *(myTarget++) = (UChar) ch;
                *(myOffsets++) = offsetNum;
            }
            else {
                /* write out the surrogates */
                *(myTarget++) = U16_LEAD(ch);
                *myOffsets++ = offsetNum;
                ch = U16_TRAIL(ch);
                if (myTarget < targetLimit)
                {
                    *(myTarget++) = (UChar)ch;
                    *(myOffsets++) = offsetNum;
                }
                else {
                    /* Put in overflow buffer (not handled here) */
                    args->converter->UCharErrorBuffer[0] = (UChar) ch;
                    args->converter->UCharErrorBufferLength = 1;
                    *err = U_BUFFER_OVERFLOW_ERROR;
                    break;
                }
            }
        }
        else {
            args->converter->toULength = (int8_t)i;
            *err = U_ILLEGAL_CHAR_FOUND;
            break;
        }
        offsetNum += i;
    }

donefornow:
    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err))
    {
        /* End of target buffer */
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = myTarget;
    args->source = (const char *) mySource;
    args->offsets = myOffsets;
}